

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pm_column_tests.h
# Opt level: O0

void column_test_common_z2_operators<Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Chain_col_options<true,(Gudhi::persistence_matrix::Column_types)1,true,false,false>>>>
               (vector<Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_false,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_false,_false>_>_>_>_>
                *matrix)

{
  initializer_list<bool> __l;
  initializer_list<unsigned_int> __l_00;
  initializer_list<bool> __l_01;
  initializer_list<unsigned_int> __l_02;
  initializer_list<bool> __l_03;
  initializer_list<unsigned_int> __l_04;
  initializer_list<bool> __l_05;
  initializer_list<unsigned_int> __l_06;
  initializer_list<bool> __l_07;
  initializer_list<unsigned_int> __l_08;
  initializer_list<bool> __l_09;
  initializer_list<unsigned_int> __l_10;
  initializer_list<bool> __l_11;
  initializer_list<unsigned_int> __l_12;
  undefined8 uVar1;
  bool bVar2;
  reference pvVar3;
  reference pvVar4;
  lazy_ostream *plVar5;
  basic_cstring<const_char> local_9b0;
  basic_cstring<const_char> local_9a0;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  local_990;
  assertion_result local_970;
  basic_cstring<const_char> local_958;
  basic_cstring<const_char> local_948;
  basic_cstring<const_char> local_938;
  basic_cstring<const_char> local_928;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  local_918;
  assertion_result local_8f8;
  basic_cstring<const_char> local_8e0;
  basic_cstring<const_char> local_8d0;
  basic_cstring<const_char> local_8c0;
  basic_cstring<const_char> local_8b0;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  local_8a0;
  assertion_result local_880;
  basic_cstring<const_char> local_868;
  basic_cstring<const_char> local_858;
  basic_cstring<const_char> local_848;
  basic_cstring<const_char> local_838;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  local_828;
  assertion_result local_808;
  basic_cstring<const_char> local_7f0;
  basic_cstring<const_char> local_7e0;
  bool local_7cf [7];
  iterator local_7c8;
  undefined8 local_7c0;
  uint local_7b8 [4];
  iterator local_7a8;
  undefined8 local_7a0;
  Field_element local_798;
  bool local_797 [7];
  iterator local_790;
  undefined8 local_788;
  uint local_780 [4];
  iterator local_770;
  undefined8 local_768;
  Field_element local_759;
  basic_cstring<const_char> local_758;
  basic_cstring<const_char> local_748;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  local_738;
  assertion_result local_718;
  basic_cstring<const_char> local_700;
  basic_cstring<const_char> local_6f0;
  bool local_6df [7];
  iterator local_6d8;
  undefined8 local_6d0;
  uint local_6c8 [8];
  iterator local_6a8;
  undefined8 local_6a0;
  Field_element local_691;
  basic_cstring<const_char> local_690;
  basic_cstring<const_char> local_680;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  local_670;
  assertion_result local_650;
  basic_cstring<const_char> local_638;
  basic_cstring<const_char> local_628;
  bool local_617 [7];
  iterator local_610;
  undefined8 local_608;
  uint local_5fc [3];
  iterator local_5f0;
  undefined8 local_5e8;
  Field_element local_5d9;
  basic_cstring<const_char> local_5d8;
  basic_cstring<const_char> local_5c8;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  local_5b8;
  assertion_result local_598;
  basic_cstring<const_char> local_580;
  basic_cstring<const_char> local_570;
  basic_cstring<const_char> local_560;
  basic_cstring<const_char> local_550;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  local_540;
  assertion_result local_520;
  basic_cstring<const_char> local_508;
  basic_cstring<const_char> local_4f8;
  basic_cstring<const_char> local_4e8;
  basic_cstring<const_char> local_4d8;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  local_4c8;
  assertion_result local_4a8;
  basic_cstring<const_char> local_490;
  basic_cstring<const_char> local_480;
  basic_cstring<const_char> local_470;
  basic_cstring<const_char> local_460;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  local_450;
  assertion_result local_430;
  basic_cstring<const_char> local_418;
  basic_cstring<const_char> local_408;
  basic_cstring<const_char> local_3f8;
  basic_cstring<const_char> local_3e8;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  local_3d8;
  assertion_result local_3b8;
  basic_cstring<const_char> local_3a0;
  basic_cstring<const_char> local_390;
  bool local_37f [7];
  iterator local_378;
  undefined8 local_370;
  uint local_368 [6];
  iterator local_350;
  undefined8 local_348;
  bool local_33f [7];
  iterator local_338;
  undefined8 local_330;
  uint local_324 [3];
  iterator local_318;
  undefined8 local_310;
  basic_cstring<const_char> local_308;
  basic_cstring<const_char> local_2f8;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  local_2e8;
  assertion_result local_2c8;
  basic_cstring<const_char> local_2b0;
  basic_cstring<const_char> local_2a0;
  basic_cstring<const_char> local_290;
  basic_cstring<const_char> local_280;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  local_270;
  assertion_result local_250;
  basic_cstring<const_char> local_238;
  basic_cstring<const_char> local_228;
  basic_cstring<const_char> local_218;
  basic_cstring<const_char> local_208;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  local_1f8;
  assertion_result local_1d8;
  basic_cstring<const_char> local_1c0;
  basic_cstring<const_char> local_1b0;
  basic_cstring<const_char> local_1a0;
  basic_cstring<const_char> local_190;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  local_180;
  assertion_result local_160;
  basic_cstring<const_char> local_148;
  basic_cstring<const_char> local_138;
  basic_cstring<const_char> local_128;
  basic_cstring<const_char> local_118;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  local_108;
  assertion_result local_e8;
  basic_cstring<const_char> local_d0;
  basic_cstring<const_char> local_c0;
  bool local_af [7];
  iterator local_a8;
  undefined8 local_a0;
  uint local_94 [3];
  iterator local_88;
  undefined8 local_80;
  undefined1 local_68 [8];
  vector<bool,_std::allocator<bool>_> veccont;
  set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> setcont;
  vector<Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_false,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_false,_false>_>_>_>_>
  *matrix_local;
  
  std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::set
            ((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *)
             &veccont.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
              _M_end_of_storage);
  std::vector<bool,_std::allocator<bool>_>::vector((vector<bool,_std::allocator<bool>_> *)local_68);
  pvVar3 = std::
           vector<Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_false,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_false,_false>_>_>_>_>
           ::operator[](matrix,1);
  pvVar4 = std::
           vector<Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_false,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_false,_false>_>_>_>_>
           ::operator[](matrix,0);
  Gudhi::persistence_matrix::
  Set_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_false,_false>_>_>
  ::operator+=(pvVar4,pvVar3);
  pvVar3 = std::
           vector<Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_false,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_false,_false>_>_>_>_>
           ::operator[](matrix,2);
  pvVar4 = std::
           vector<Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_false,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_false,_false>_>_>_>_>
           ::operator[](matrix,1);
  Gudhi::persistence_matrix::
  Set_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_false,_false>_>_>
  ::operator+=(pvVar4,pvVar3);
  local_94[0] = 2;
  local_94[1] = 3;
  local_94[2] = 6;
  local_88 = local_94;
  local_80 = 3;
  __l_12._M_len = 3;
  __l_12._M_array = local_88;
  std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::operator=
            ((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *)
             &veccont.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
              _M_end_of_storage,__l_12);
  local_af[0] = false;
  local_af[1] = false;
  local_af[2] = true;
  local_af[3] = true;
  local_af[4] = false;
  local_af[5] = false;
  local_af[6] = true;
  local_a8 = local_af;
  local_a0 = 7;
  __l_11._M_len = 7;
  __l_11._M_array = local_a8;
  std::vector<bool,_std::allocator<bool>_>::operator=
            ((vector<bool,_std::allocator<bool>_> *)local_68,__l_11);
  pvVar3 = std::
           vector<Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_false,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_false,_false>_>_>_>_>
           ::operator[](matrix,0);
  column_test_common_content_access<Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Chain_col_options<true,(Gudhi::persistence_matrix::Column_types)1,true,false,false>>>,unsigned_int>
            (pvVar3,(set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *)
                    &veccont.super__Bvector_base<std::allocator<bool>_>._M_impl.
                     super__Bvector_impl_data._M_end_of_storage,
             (vector<bool,_std::allocator<bool>_> *)local_68);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_c0,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
               ,0x73);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_d0);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_c0,0x1c5,&local_d0);
    pvVar3 = std::
             vector<Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_false,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_false,_false>_>_>_>_>
             ::operator[](matrix,1);
    pvVar4 = std::
             vector<Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_false,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_false,_false>_>_>_>_>
             ::operator[](matrix,1);
    bVar2 = Gudhi::persistence_matrix::operator==(pvVar3,pvVar4);
    boost::test_tools::assertion_result::assertion_result(&local_e8,bVar2);
    plVar5 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_118,"matrix[1] == matrix[1]",0x16);
    boost::unit_test::operator<<(&local_108,plVar5,&local_118);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_128,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
               ,0x73);
    boost::test_tools::tt_detail::report_assertion(&local_e8,&local_108,&local_128,0x1c5,1,0,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(&local_108);
    boost::test_tools::assertion_result::~assertion_result(&local_e8);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_138,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
               ,0x73);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_148);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_138,0x1c6,&local_148);
    pvVar3 = std::
             vector<Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_false,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_false,_false>_>_>_>_>
             ::operator[](matrix,1);
    pvVar4 = std::
             vector<Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_false,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_false,_false>_>_>_>_>
             ::operator[](matrix,3);
    bVar2 = Gudhi::persistence_matrix::operator==(pvVar3,pvVar4);
    boost::test_tools::assertion_result::assertion_result(&local_160,bVar2);
    plVar5 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_190,"matrix[1] == matrix[3]",0x16);
    boost::unit_test::operator<<(&local_180,plVar5,&local_190);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_1a0,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
               ,0x73);
    boost::test_tools::tt_detail::report_assertion(&local_160,&local_180,&local_1a0,0x1c6,1,0,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(&local_180);
    boost::test_tools::assertion_result::~assertion_result(&local_160);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_1b0,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
               ,0x73);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_1c0);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_1b0,0x1c7,&local_1c0);
    pvVar3 = std::
             vector<Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_false,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_false,_false>_>_>_>_>
             ::operator[](matrix,1);
    pvVar4 = std::
             vector<Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_false,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_false,_false>_>_>_>_>
             ::operator[](matrix,0);
    bVar2 = Gudhi::persistence_matrix::operator<(pvVar3,pvVar4);
    boost::test_tools::assertion_result::assertion_result(&local_1d8,bVar2);
    plVar5 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_208,"matrix[1] < matrix[0]",0x15);
    boost::unit_test::operator<<(&local_1f8,plVar5,&local_208);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_218,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
               ,0x73);
    boost::test_tools::tt_detail::report_assertion(&local_1d8,&local_1f8,&local_218,0x1c7,1,0,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(&local_1f8);
    boost::test_tools::assertion_result::~assertion_result(&local_1d8);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_228,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
               ,0x73);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_238);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_228,0x1cb,&local_238);
    pvVar3 = std::
             vector<Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_false,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_false,_false>_>_>_>_>
             ::operator[](matrix,2);
    pvVar4 = std::
             vector<Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_false,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_false,_false>_>_>_>_>
             ::operator[](matrix,0);
    bVar2 = Gudhi::persistence_matrix::operator<(pvVar3,pvVar4);
    boost::test_tools::assertion_result::assertion_result(&local_250,bVar2);
    plVar5 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_280,"matrix[2] < matrix[0]",0x15);
    boost::unit_test::operator<<(&local_270,plVar5,&local_280);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_290,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
               ,0x73);
    boost::test_tools::tt_detail::report_assertion(&local_250,&local_270,&local_290,0x1cb,1,0,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(&local_270);
    boost::test_tools::assertion_result::~assertion_result(&local_250);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_2a0,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
               ,0x73);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_2b0);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_2a0,0x1cd,&local_2b0);
    pvVar3 = std::
             vector<Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_false,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_false,_false>_>_>_>_>
             ::operator[](matrix,0);
    pvVar4 = std::
             vector<Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_false,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_false,_false>_>_>_>_>
             ::operator[](matrix,0);
    bVar2 = Gudhi::persistence_matrix::operator<(pvVar3,pvVar4);
    boost::test_tools::assertion_result::assertion_result(&local_2c8,(bool)(~bVar2 & 1));
    plVar5 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_2f8,"!(matrix[0] < matrix[0])",0x18);
    boost::unit_test::operator<<(&local_2e8,plVar5,&local_2f8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_308,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
               ,0x73);
    boost::test_tools::tt_detail::report_assertion(&local_2c8,&local_2e8,&local_308,0x1cd,1,0,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(&local_2e8);
    boost::test_tools::assertion_result::~assertion_result(&local_2c8);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  pvVar3 = std::
           vector<Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_false,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_false,_false>_>_>_>_>
           ::operator[](matrix,0);
  Gudhi::persistence_matrix::
  Set_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_false,_false>_>_>
  ::operator*=(pvVar3,5);
  pvVar3 = std::
           vector<Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_false,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_false,_false>_>_>_>_>
           ::operator[](matrix,2);
  Gudhi::persistence_matrix::
  Set_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_false,_false>_>_>
  ::operator*=(pvVar3,1);
  local_324[0] = 2;
  local_324[1] = 3;
  local_324[2] = 6;
  local_318 = local_324;
  local_310 = 3;
  __l_10._M_len = 3;
  __l_10._M_array = local_318;
  std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::operator=
            ((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *)
             &veccont.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
              _M_end_of_storage,__l_10);
  local_33f[0] = false;
  local_33f[1] = false;
  local_33f[2] = true;
  local_33f[3] = true;
  local_33f[4] = false;
  local_33f[5] = false;
  local_33f[6] = true;
  local_338 = local_33f;
  local_330 = 7;
  __l_09._M_len = 7;
  __l_09._M_array = local_338;
  std::vector<bool,_std::allocator<bool>_>::operator=
            ((vector<bool,_std::allocator<bool>_> *)local_68,__l_09);
  pvVar3 = std::
           vector<Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_false,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_false,_false>_>_>_>_>
           ::operator[](matrix,0);
  column_test_common_content_access<Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Chain_col_options<true,(Gudhi::persistence_matrix::Column_types)1,true,false,false>>>,unsigned_int>
            (pvVar3,(set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *)
                    &veccont.super__Bvector_base<std::allocator<bool>_>._M_impl.
                     super__Bvector_impl_data._M_end_of_storage,
             (vector<bool,_std::allocator<bool>_> *)local_68);
  local_368[0] = 0;
  local_368[1] = 1;
  local_368[2] = 2;
  local_368[3] = 5;
  local_368[4] = 6;
  local_350 = local_368;
  local_348 = 5;
  __l_08._M_len = 5;
  __l_08._M_array = local_350;
  std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::operator=
            ((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *)
             &veccont.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
              _M_end_of_storage,__l_08);
  local_37f[0] = true;
  local_37f[1] = true;
  local_37f[2] = true;
  local_37f[3] = false;
  local_37f[4] = false;
  local_37f[5] = true;
  local_37f[6] = true;
  local_378 = local_37f;
  local_370 = 7;
  __l_07._M_len = 7;
  __l_07._M_array = local_378;
  std::vector<bool,_std::allocator<bool>_>::operator=
            ((vector<bool,_std::allocator<bool>_> *)local_68,__l_07);
  pvVar3 = std::
           vector<Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_false,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_false,_false>_>_>_>_>
           ::operator[](matrix,2);
  column_test_common_content_access<Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Chain_col_options<true,(Gudhi::persistence_matrix::Column_types)1,true,false,false>>>,unsigned_int>
            (pvVar3,(set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *)
                    &veccont.super__Bvector_base<std::allocator<bool>_>._M_impl.
                     super__Bvector_impl_data._M_end_of_storage,
             (vector<bool,_std::allocator<bool>_> *)local_68);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_390,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
               ,0x73);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_3a0);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_390,0x1d8,&local_3a0);
    pvVar3 = std::
             vector<Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_false,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_false,_false>_>_>_>_>
             ::operator[](matrix,0);
    pvVar4 = std::
             vector<Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_false,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_false,_false>_>_>_>_>
             ::operator[](matrix,2);
    bVar2 = Gudhi::persistence_matrix::operator==(pvVar3,pvVar4);
    boost::test_tools::assertion_result::assertion_result(&local_3b8,(bool)(~bVar2 & 1));
    plVar5 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_3e8,"!(matrix[0] == matrix[2])",0x19);
    boost::unit_test::operator<<(&local_3d8,plVar5,&local_3e8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_3f8,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
               ,0x73);
    boost::test_tools::tt_detail::report_assertion(&local_3b8,&local_3d8,&local_3f8,0x1d8,1,0,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(&local_3d8);
    boost::test_tools::assertion_result::~assertion_result(&local_3b8);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_408,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
               ,0x73);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_418);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_408,0x1d9,&local_418);
    pvVar3 = std::
             vector<Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_false,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_false,_false>_>_>_>_>
             ::operator[](matrix,2);
    pvVar4 = std::
             vector<Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_false,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_false,_false>_>_>_>_>
             ::operator[](matrix,2);
    bVar2 = Gudhi::persistence_matrix::operator==(pvVar3,pvVar4);
    boost::test_tools::assertion_result::assertion_result(&local_430,bVar2);
    plVar5 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_460,"matrix[2] == matrix[2]",0x16);
    boost::unit_test::operator<<(&local_450,plVar5,&local_460);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_470,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
               ,0x73);
    boost::test_tools::tt_detail::report_assertion(&local_430,&local_450,&local_470,0x1d9,1,0,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(&local_450);
    boost::test_tools::assertion_result::~assertion_result(&local_430);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_480,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
               ,0x73);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_490);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_480,0x1da,&local_490);
    pvVar3 = std::
             vector<Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_false,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_false,_false>_>_>_>_>
             ::operator[](matrix,1);
    pvVar4 = std::
             vector<Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_false,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_false,_false>_>_>_>_>
             ::operator[](matrix,0);
    bVar2 = Gudhi::persistence_matrix::operator<(pvVar3,pvVar4);
    boost::test_tools::assertion_result::assertion_result(&local_4a8,bVar2);
    plVar5 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_4d8,"matrix[1] < matrix[0]",0x15);
    boost::unit_test::operator<<(&local_4c8,plVar5,&local_4d8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_4e8,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
               ,0x73);
    boost::test_tools::tt_detail::report_assertion(&local_4a8,&local_4c8,&local_4e8,0x1da,1,0,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(&local_4c8);
    boost::test_tools::assertion_result::~assertion_result(&local_4a8);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_4f8,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
               ,0x73);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_508);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_4f8,0x1de,&local_508);
    pvVar3 = std::
             vector<Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_false,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_false,_false>_>_>_>_>
             ::operator[](matrix,2);
    pvVar4 = std::
             vector<Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_false,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_false,_false>_>_>_>_>
             ::operator[](matrix,0);
    bVar2 = Gudhi::persistence_matrix::operator<(pvVar3,pvVar4);
    boost::test_tools::assertion_result::assertion_result(&local_520,bVar2);
    plVar5 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_550,"matrix[2] < matrix[0]",0x15);
    boost::unit_test::operator<<(&local_540,plVar5,&local_550);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_560,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
               ,0x73);
    boost::test_tools::tt_detail::report_assertion(&local_520,&local_540,&local_560,0x1de,1,0,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(&local_540);
    boost::test_tools::assertion_result::~assertion_result(&local_520);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_570,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
               ,0x73);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_580);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_570,0x1e0,&local_580);
    pvVar3 = std::
             vector<Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_false,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_false,_false>_>_>_>_>
             ::operator[](matrix,0);
    pvVar4 = std::
             vector<Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_false,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_false,_false>_>_>_>_>
             ::operator[](matrix,0);
    bVar2 = Gudhi::persistence_matrix::operator<(pvVar3,pvVar4);
    boost::test_tools::assertion_result::assertion_result(&local_598,(bool)(~bVar2 & 1));
    plVar5 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_5c8,"!(matrix[0] < matrix[0])",0x18);
    boost::unit_test::operator<<(&local_5b8,plVar5,&local_5c8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_5d8,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
               ,0x73);
    boost::test_tools::tt_detail::report_assertion(&local_598,&local_5b8,&local_5d8,0x1e0,1,0,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(&local_5b8);
    boost::test_tools::assertion_result::~assertion_result(&local_598);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  pvVar3 = std::
           vector<Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_false,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_false,_false>_>_>_>_>
           ::operator[](matrix,4);
  local_5d9 = true;
  pvVar4 = std::
           vector<Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_false,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_false,_false>_>_>_>_>
           ::operator[](matrix,5);
  Gudhi::persistence_matrix::
  Set_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_false,_false>_>_>
  ::multiply_target_and_add(pvVar3,&local_5d9,pvVar4);
  local_5fc[0] = 2;
  local_5fc[1] = 3;
  local_5fc[2] = 6;
  local_5f0 = local_5fc;
  local_5e8 = 3;
  __l_06._M_len = 3;
  __l_06._M_array = local_5f0;
  std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::operator=
            ((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *)
             &veccont.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
              _M_end_of_storage,__l_06);
  local_617[0] = false;
  local_617[1] = false;
  local_617[2] = true;
  local_617[3] = true;
  local_617[4] = false;
  local_617[5] = false;
  local_617[6] = true;
  local_610 = local_617;
  local_608 = 7;
  __l_05._M_len = 7;
  __l_05._M_array = local_610;
  std::vector<bool,_std::allocator<bool>_>::operator=
            ((vector<bool,_std::allocator<bool>_> *)local_68,__l_05);
  pvVar3 = std::
           vector<Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_false,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_false,_false>_>_>_>_>
           ::operator[](matrix,4);
  column_test_common_content_access<Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Chain_col_options<true,(Gudhi::persistence_matrix::Column_types)1,true,false,false>>>,unsigned_int>
            (pvVar3,(set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *)
                    &veccont.super__Bvector_base<std::allocator<bool>_>._M_impl.
                     super__Bvector_impl_data._M_end_of_storage,
             (vector<bool,_std::allocator<bool>_> *)local_68);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_628,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
               ,0x73);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_638);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_628,0x1e7,&local_638);
    pvVar3 = std::
             vector<Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_false,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_false,_false>_>_>_>_>
             ::operator[](matrix,4);
    pvVar4 = std::
             vector<Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_false,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_false,_false>_>_>_>_>
             ::operator[](matrix,0);
    bVar2 = Gudhi::persistence_matrix::operator==(pvVar3,pvVar4);
    boost::test_tools::assertion_result::assertion_result(&local_650,bVar2);
    plVar5 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_680,"matrix[4] == matrix[0]",0x16);
    boost::unit_test::operator<<(&local_670,plVar5,&local_680);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_690,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
               ,0x73);
    boost::test_tools::tt_detail::report_assertion(&local_650,&local_670,&local_690,0x1e7,1,0,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(&local_670);
    boost::test_tools::assertion_result::~assertion_result(&local_650);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  pvVar3 = std::
           vector<Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_false,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_false,_false>_>_>_>_>
           ::operator[](matrix,5);
  pvVar4 = std::
           vector<Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_false,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_false,_false>_>_>_>_>
           ::operator[](matrix,3);
  local_691 = true;
  Gudhi::persistence_matrix::
  Set_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_false,_false>_>_>
  ::multiply_source_and_add(pvVar3,pvVar4,&local_691);
  local_6c8[0] = 0;
  local_6c8[1] = 1;
  local_6c8[2] = 2;
  local_6c8[3] = 5;
  local_6c8[4] = 6;
  local_6a8 = local_6c8;
  local_6a0 = 5;
  __l_04._M_len = 5;
  __l_04._M_array = local_6a8;
  std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::operator=
            ((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *)
             &veccont.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
              _M_end_of_storage,__l_04);
  local_6df[0] = true;
  local_6df[1] = true;
  local_6df[2] = true;
  local_6df[3] = false;
  local_6df[4] = false;
  local_6df[5] = true;
  local_6df[6] = true;
  local_6d8 = local_6df;
  local_6d0 = 7;
  __l_03._M_len = 7;
  __l_03._M_array = local_6d8;
  std::vector<bool,_std::allocator<bool>_>::operator=
            ((vector<bool,_std::allocator<bool>_> *)local_68,__l_03);
  pvVar3 = std::
           vector<Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_false,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_false,_false>_>_>_>_>
           ::operator[](matrix,5);
  column_test_common_content_access<Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Chain_col_options<true,(Gudhi::persistence_matrix::Column_types)1,true,false,false>>>,unsigned_int>
            (pvVar3,(set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *)
                    &veccont.super__Bvector_base<std::allocator<bool>_>._M_impl.
                     super__Bvector_impl_data._M_end_of_storage,
             (vector<bool,_std::allocator<bool>_> *)local_68);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_6f0,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
               ,0x73);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_700);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_6f0,0x1ed,&local_700);
    pvVar3 = std::
             vector<Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_false,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_false,_false>_>_>_>_>
             ::operator[](matrix,5);
    pvVar4 = std::
             vector<Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_false,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_false,_false>_>_>_>_>
             ::operator[](matrix,2);
    bVar2 = Gudhi::persistence_matrix::operator==(pvVar3,pvVar4);
    boost::test_tools::assertion_result::assertion_result(&local_718,bVar2);
    plVar5 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_748,"matrix[5] == matrix[2]",0x16);
    boost::unit_test::operator<<(&local_738,plVar5,&local_748);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_758,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
               ,0x73);
    boost::test_tools::tt_detail::report_assertion(&local_718,&local_738,&local_758,0x1ed,1,0,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(&local_738);
    boost::test_tools::assertion_result::~assertion_result(&local_718);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  pvVar3 = std::
           vector<Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_false,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_false,_false>_>_>_>_>
           ::operator[](matrix,5);
  pvVar4 = std::
           vector<Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_false,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_false,_false>_>_>_>_>
           ::operator[](matrix,4);
  local_759 = true;
  Gudhi::persistence_matrix::
  Set_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_false,_false>_>_>
  ::multiply_source_and_add(pvVar3,pvVar4,&local_759);
  local_780[0] = 0;
  local_780[1] = 1;
  local_780[2] = 3;
  local_780[3] = 5;
  local_770 = local_780;
  local_768 = 4;
  __l_02._M_len = 4;
  __l_02._M_array = local_770;
  std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::operator=
            ((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *)
             &veccont.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
              _M_end_of_storage,__l_02);
  local_797[0] = true;
  local_797[1] = true;
  local_797[2] = false;
  local_797[3] = true;
  local_797[4] = false;
  local_797[5] = true;
  local_797[6] = false;
  local_790 = local_797;
  local_788 = 7;
  __l_01._M_len = 7;
  __l_01._M_array = local_790;
  std::vector<bool,_std::allocator<bool>_>::operator=
            ((vector<bool,_std::allocator<bool>_> *)local_68,__l_01);
  pvVar3 = std::
           vector<Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_false,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_false,_false>_>_>_>_>
           ::operator[](matrix,5);
  column_test_common_content_access<Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Chain_col_options<true,(Gudhi::persistence_matrix::Column_types)1,true,false,false>>>,unsigned_int>
            (pvVar3,(set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *)
                    &veccont.super__Bvector_base<std::allocator<bool>_>._M_impl.
                     super__Bvector_impl_data._M_end_of_storage,
             (vector<bool,_std::allocator<bool>_> *)local_68);
  pvVar3 = std::
           vector<Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_false,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_false,_false>_>_>_>_>
           ::operator[](matrix,3);
  local_798 = true;
  pvVar4 = std::
           vector<Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_false,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_false,_false>_>_>_>_>
           ::operator[](matrix,5);
  Gudhi::persistence_matrix::
  Set_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_false,_false>_>_>
  ::multiply_target_and_add(pvVar3,&local_798,pvVar4);
  local_7b8[0] = 0;
  local_7b8[1] = 1;
  local_7b8[2] = 3;
  local_7b8[3] = 5;
  local_7a8 = local_7b8;
  local_7a0 = 4;
  __l_00._M_len = 4;
  __l_00._M_array = local_7a8;
  std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::operator=
            ((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *)
             &veccont.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
              _M_end_of_storage,__l_00);
  local_7cf[0] = true;
  local_7cf[1] = true;
  local_7cf[2] = false;
  local_7cf[3] = true;
  local_7cf[4] = false;
  local_7cf[5] = true;
  local_7cf[6] = false;
  local_7c8 = local_7cf;
  local_7c0 = 7;
  __l._M_len = 7;
  __l._M_array = local_7c8;
  std::vector<bool,_std::allocator<bool>_>::operator=
            ((vector<bool,_std::allocator<bool>_> *)local_68,__l);
  pvVar3 = std::
           vector<Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_false,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_false,_false>_>_>_>_>
           ::operator[](matrix,3);
  column_test_common_content_access<Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Chain_col_options<true,(Gudhi::persistence_matrix::Column_types)1,true,false,false>>>,unsigned_int>
            (pvVar3,(set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *)
                    &veccont.super__Bvector_base<std::allocator<bool>_>._M_impl.
                     super__Bvector_impl_data._M_end_of_storage,
             (vector<bool,_std::allocator<bool>_> *)local_68);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_7e0,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
               ,0x73);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_7f0);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_7e0,0x1f8,&local_7f0);
    pvVar3 = std::
             vector<Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_false,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_false,_false>_>_>_>_>
             ::operator[](matrix,3);
    pvVar4 = std::
             vector<Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_false,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_false,_false>_>_>_>_>
             ::operator[](matrix,5);
    bVar2 = Gudhi::persistence_matrix::operator==(pvVar3,pvVar4);
    boost::test_tools::assertion_result::assertion_result(&local_808,bVar2);
    plVar5 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_838,"matrix[3] == matrix[5]",0x16);
    boost::unit_test::operator<<(&local_828,plVar5,&local_838);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_848,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
               ,0x73);
    boost::test_tools::tt_detail::report_assertion(&local_808,&local_828,&local_848,0x1f8,1,0,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(&local_828);
    boost::test_tools::assertion_result::~assertion_result(&local_808);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_858,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
               ,0x73);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_868);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_858,0x1f9,&local_868);
    pvVar3 = std::
             vector<Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_false,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_false,_false>_>_>_>_>
             ::operator[](matrix,5);
    pvVar4 = std::
             vector<Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_false,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_false,_false>_>_>_>_>
             ::operator[](matrix,3);
    bVar2 = Gudhi::persistence_matrix::operator<(pvVar3,pvVar4);
    boost::test_tools::assertion_result::assertion_result(&local_880,(bool)(~bVar2 & 1));
    plVar5 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_8b0,"!(matrix[5] < matrix[3])",0x18);
    boost::unit_test::operator<<(&local_8a0,plVar5,&local_8b0);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_8c0,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
               ,0x73);
    boost::test_tools::tt_detail::report_assertion(&local_880,&local_8a0,&local_8c0,0x1f9,1,0,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(&local_8a0);
    boost::test_tools::assertion_result::~assertion_result(&local_880);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_8d0,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
               ,0x73);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_8e0);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_8d0,0x1fa,&local_8e0);
    pvVar3 = std::
             vector<Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_false,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_false,_false>_>_>_>_>
             ::operator[](matrix,3);
    pvVar4 = std::
             vector<Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_false,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_false,_false>_>_>_>_>
             ::operator[](matrix,5);
    bVar2 = Gudhi::persistence_matrix::operator<(pvVar3,pvVar4);
    boost::test_tools::assertion_result::assertion_result(&local_8f8,(bool)(~bVar2 & 1));
    plVar5 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_928,"!(matrix[3] < matrix[5])",0x18);
    boost::unit_test::operator<<(&local_918,plVar5,&local_928);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_938,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
               ,0x73);
    boost::test_tools::tt_detail::report_assertion(&local_8f8,&local_918,&local_938,0x1fa,1,0,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(&local_918);
    boost::test_tools::assertion_result::~assertion_result(&local_8f8);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_948,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
               ,0x73);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_958);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_948,0x1fb,&local_958);
    pvVar3 = std::
             vector<Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_false,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_false,_false>_>_>_>_>
             ::operator[](matrix,5);
    pvVar4 = std::
             vector<Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_false,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_false,_false>_>_>_>_>
             ::operator[](matrix,4);
    bVar2 = Gudhi::persistence_matrix::operator<(pvVar3,pvVar4);
    boost::test_tools::assertion_result::assertion_result(&local_970,bVar2);
    plVar5 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_9a0,"matrix[5] < matrix[4]",0x15);
    boost::unit_test::operator<<(&local_990,plVar5,&local_9a0);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_9b0,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
               ,0x73);
    boost::test_tools::tt_detail::report_assertion(&local_970,&local_990,&local_9b0,0x1fb,1,0,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(&local_990);
    boost::test_tools::assertion_result::~assertion_result(&local_970);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  std::vector<bool,_std::allocator<bool>_>::~vector((vector<bool,_std::allocator<bool>_> *)local_68)
  ;
  std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::~set
            ((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *)
             &veccont.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
              _M_end_of_storage);
  return;
}

Assistant:

void column_test_common_z2_operators(std::vector<Column>& matrix) {
  std::set<unsigned int> setcont;
  std::vector<typename Column::Field_element> veccont;

  matrix[0] += matrix[1];
  matrix[1] += matrix[2];

  setcont = {2, 3, 6};
  veccont = {0, 0, 1, 1, 0, 0, 1};
  column_test_common_content_access(matrix[0], setcont, veccont);
  BOOST_CHECK(matrix[1] == matrix[1]);
  BOOST_CHECK(matrix[1] == matrix[3]);
  BOOST_CHECK(matrix[1] < matrix[0]);
  if constexpr (Column::Master::Option_list::column_type == Column_types::HEAP) {
    BOOST_CHECK(matrix[0] < matrix[2]);  // order different for heap columns
  } else {
    BOOST_CHECK(matrix[2] < matrix[0]);
  }
  BOOST_CHECK(!(matrix[0] < matrix[0]));

  matrix[0] *= 5;
  matrix[2] *= 1;

  setcont = {2, 3, 6};
  veccont = {0, 0, 1, 1, 0, 0, 1};
  column_test_common_content_access(matrix[0], setcont, veccont);
  setcont = {0, 1, 2, 5, 6};
  veccont = {1, 1, 1, 0, 0, 1, 1};
  column_test_common_content_access(matrix[2], setcont, veccont);
  BOOST_CHECK(!(matrix[0] == matrix[2]));
  BOOST_CHECK(matrix[2] == matrix[2]);
  BOOST_CHECK(matrix[1] < matrix[0]);
  if constexpr (Column::Master::Option_list::column_type == Column_types::HEAP) {
    BOOST_CHECK(matrix[0] < matrix[2]);  // order different for heap columns
  } else {
    BOOST_CHECK(matrix[2] < matrix[0]);
  }
  BOOST_CHECK(!(matrix[0] < matrix[0]));

  // this = v * this + column
  matrix[4].multiply_target_and_add(3, matrix[5]);
  setcont = {2, 3, 6};
  veccont = {0, 0, 1, 1, 0, 0, 1};
  column_test_common_content_access(matrix[4], setcont, veccont);
  BOOST_CHECK(matrix[4] == matrix[0]);
  // this = this + column * v
  matrix[5].multiply_source_and_add(matrix[3], 3);
  setcont = {0, 1, 2, 5, 6};
  veccont = {1, 1, 1, 0, 0, 1, 1};
  column_test_common_content_access(matrix[5], setcont, veccont);
  BOOST_CHECK(matrix[5] == matrix[2]);
  // this = this + column * v
  matrix[5].multiply_source_and_add(matrix[4], 3);
  setcont = {0, 1, 3, 5};
  veccont = {1, 1, 0, 1, 0, 1, 0};
  column_test_common_content_access(matrix[5], setcont, veccont);
  // this = v * this + column
  matrix[3].multiply_target_and_add(3, matrix[5]);
  setcont = {0, 1, 3, 5};
  veccont = {1, 1, 0, 1, 0, 1, 0};
  column_test_common_content_access(matrix[3], setcont, veccont);
  BOOST_CHECK(matrix[3] == matrix[5]);
  BOOST_CHECK(!(matrix[5] < matrix[3]));
  BOOST_CHECK(!(matrix[3] < matrix[5]));
  BOOST_CHECK(matrix[5] < matrix[4]);
}